

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexBuilder.cpp
# Opt level: O2

bool __thiscall ConvexBuilder::combineHulls(ConvexBuilder *this)

{
  ChUll *this_00;
  ChUll *pCVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ConvexBuilder *this_01;
  long lVar5;
  long lVar6;
  ChUll *cr;
  cbtAlignedObjectArray<ChUll_*> *local_70;
  long local_68;
  ChUll *cr_1;
  ChUll *merge;
  ChUllVector output;
  
  local_70 = &this->mChulls;
  this_01 = this;
  sortChulls(this,local_70);
  output.m_ownsMemory = true;
  output.m_data = (ChUll **)0x0;
  output.m_size = 0;
  output.m_capacity = 0;
  uVar4 = 1;
  lVar6 = 0;
  do {
    iVar2 = (this->mChulls).m_size;
    lVar3 = (long)iVar2;
    if (lVar3 <= lVar6) {
LAB_00e2f080:
      cbtAlignedObjectArray<ChUll_*>::~cbtAlignedObjectArray(&output);
      return lVar6 < lVar3;
    }
    cr = (this->mChulls).m_data[lVar6];
    local_68 = lVar6;
    for (lVar5 = 0; lVar5 < iVar2; lVar5 = lVar5 + 1) {
      this_00 = (ChUll *)(this->mChulls).m_data[lVar5];
      if ((ChUll *)cr != this_00) {
        merge = canMerge(this_01,cr,(ChUll *)this_00);
        if (merge != (ChUll *)0x0) {
          cbtAlignedObjectArray<ChUll_*>::push_back(&output,&merge);
          for (; pCVar1 = cr, uVar4 != (uint)(this->mChulls).m_size; uVar4 = uVar4 + 1) {
            cr_1 = (this->mChulls).m_data[uVar4];
            if ((ChUll *)cr_1 != this_00) {
              cbtAlignedObjectArray<ChUll_*>::push_back(&output,&cr_1);
            }
          }
          if (cr != (ChUll *)0x0) {
            ChUll::~ChUll((ChUll *)cr);
          }
          ::operator_delete(pCVar1,0x28);
          ChUll::~ChUll(this_00);
          ::operator_delete(this_00,0x28);
          lVar6 = local_68;
          if (local_68 < lVar3) {
            cbtAlignedObjectArray<ChUll_*>::clear(local_70);
            cbtAlignedObjectArray<ChUll_*>::copyFromArray(local_70,&output);
            cbtAlignedObjectArray<ChUll_*>::clear(&output);
          }
          goto LAB_00e2f080;
        }
        iVar2 = (this->mChulls).m_size;
      }
    }
    this_01 = (ConvexBuilder *)&output;
    cbtAlignedObjectArray<ChUll_*>::push_back((cbtAlignedObjectArray<ChUll_*> *)&output,&cr);
    uVar4 = uVar4 + 1;
    lVar6 = local_68 + 1;
  } while( true );
}

Assistant:

bool ConvexBuilder::combineHulls(void)
{

	bool combine = false;

	sortChulls(mChulls); // sort the convex hulls, largest volume to least...

	ChUllVector output; // the output hulls...


	int i;

	for (i=0;i<mChulls.size() && !combine; ++i)
	{
		ChUll *cr = mChulls[i];

		int j;
		for (j=0;j<mChulls.size();j++)
		{
			ChUll *match = mChulls[j];

			if ( cr != match ) // don't try to merge a hull with itself, that be stupid
			{

				ChUll *merge = canMerge(cr,match); // if we can merge these two....

				if ( merge )
				{

					output.push_back(merge);


					++i;
					while ( i != mChulls.size() )
					{
						ChUll *cr = mChulls[i];
						if ( cr != match )
						{
							output.push_back(cr);
						}
						i++;
					}

					delete cr;
					delete match;
					combine = true;
					break;
				}
			}
		}

		if ( combine )
		{
			break;
		}
		else
		{
			output.push_back(cr);
		}

	}

	if ( combine )
	{
		mChulls.clear();
		mChulls = output;
		output.clear();
	}


	return combine;
}